

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::BindingUniformSingleBlockTest::prepareNextTestCase
          (BindingUniformSingleBlockTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  GLchar *pGVar1;
  uint uVar2;
  undefined1 local_198 [384];
  
  uVar2 = test_case_index + 1;
  if (uVar2 < 6) {
    this->m_test_stage = *(SHADER_STAGES *)(&DAT_016cbaf0 + (ulong)uVar2 * 4);
    local_198._0_8_ =
         ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Tested stage: ");
    pGVar1 = Utils::getShaderStageName(this->m_test_stage);
    std::operator<<((ostream *)this_00,pGVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return uVar2 < 6;
}

Assistant:

bool BindingUniformSingleBlockTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case 0:
		m_test_stage = Utils::VERTEX_SHADER;
		break;
	case 1:
		m_test_stage = Utils::TESS_CTRL_SHADER;
		break;
	case 2:
		m_test_stage = Utils::TESS_EVAL_SHADER;
		break;
	case 3:
		m_test_stage = Utils::GEOMETRY_SHADER;
		break;
	case 4:
		m_test_stage = Utils::FRAGMENT_SHADER;
		break;
	default:
		return false;
		break;
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Tested stage: "
										<< Utils::getShaderStageName((Utils::SHADER_STAGES)m_test_stage)
										<< tcu::TestLog::EndMessage;

	return true;
}